

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void helper_wfe_arm(CPUARMState *env)

{
  helper_yield_arm(env);
  *(undefined4 *)(env[-2].xregs + 0x1a) = 0x10004;
  cpu_loop_exit_arm((CPUState *)(env[-10].cp15.c14_pmevcntr + 0x1b));
}

Assistant:

void HELPER(wfe)(CPUARMState *env)
{
    /* This is a hint instruction that is semantically different
     * from YIELD even though we currently implement it identically.
     * Don't actually halt the CPU, just yield back to top
     * level loop. This is not going into a "low power state"
     * (ie halting until some event occurs), so we never take
     * a configurable trap to a different exception level.
     */
    HELPER(yield)(env);
}